

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.hpp
# Opt level: O2

shared_ptr<unsigned_char> __thiscall
pstore::in_memory_mapper::pointer(in_memory_mapper *this,in_memory *file,uint64_t offset)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_char> sVar1;
  shared_ptr<unsigned_char> p;
  __shared_ptr<void,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<void> local_30;
  
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<unsigned_char,void>
            (local_40,&(file->buffer_).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>
            );
  std::static_pointer_cast<unsigned_char,void>(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)
       (offset + (long)local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  __r = &local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_memory_mapper_base).ptr_,
             __r);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(__r);
  sVar1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<unsigned_char>)
         sVar1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<std::uint8_t> pointer (pstore::file::in_memory & file,
                                                      std::uint64_t const offset) {
            auto const p = std::static_pointer_cast<std::uint8_t> (file.data ());
            return std::shared_ptr<std::uint8_t> (p, p.get () + offset);
        }